

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

fourcc_t MATROSKA_MetaSeekID(matroska_seekpoint *MetaSeek)

{
  fourcc_t fVar1;
  ebml_context *peVar2;
  bool_t bVar3;
  ebml_binary *Element;
  uint8_t *Buffer;
  
  peVar2 = MATROSKA_getContextSeek();
  bVar3 = EBML_ElementIsType((ebml_element *)MetaSeek,peVar2);
  if (bVar3 == 0) {
    __assert_fail("EBML_ElementIsType((ebml_element*)MetaSeek, MATROSKA_getContextSeek())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x194,"fourcc_t MATROSKA_MetaSeekID(const matroska_seekpoint *)");
  }
  peVar2 = MATROSKA_getContextSeekID();
  Element = (ebml_binary *)EBML_MasterFindFirstElt(&MetaSeek->Base,peVar2,0,0,0);
  if (Element != (ebml_binary *)0x0) {
    Buffer = EBML_BinaryGetData(Element);
    if (Buffer != (uint8_t *)0x0) {
      fVar1 = EBML_BufferToID(Buffer);
      return fVar1;
    }
  }
  return 0;
}

Assistant:

fourcc_t MATROSKA_MetaSeekID(const matroska_seekpoint *MetaSeek)
{
    ebml_element *SeekID;
    const uint8_t *IDdata;
    assert(EBML_ElementIsType((ebml_element*)MetaSeek, MATROSKA_getContextSeek()));
    SeekID = EBML_MasterFindChild((ebml_master*)MetaSeek, MATROSKA_getContextSeekID());
    if (!SeekID)
        return 0;
    IDdata = EBML_BinaryGetData((ebml_binary*)SeekID);
    if (IDdata == NULL)
        return 0;
    return EBML_BufferToID(IDdata);
}